

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_BracketOperatorCrashing_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_BracketOperatorCrashing_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_RDI;
  int i;
  int iters;
  int *in_stack_ffffffffffffff98;
  int index;
  HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffffa0;
  int *in_stack_ffffffffffffffb0;
  int *in_stack_ffffffffffffffb8;
  value_type local_2c;
  undefined1 local_25;
  key_type local_24;
  value_type local_20;
  undefined1 local_19;
  key_type local_18;
  int local_14;
  int local_10;
  key_type local_c;
  
  local_c = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  for (local_10 = 0; local_10 < 10; local_10 = local_10 + 1) {
    for (local_14 = 0x21; index = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20), local_14 < 0x85;
        local_14 = local_14 + 1) {
      in_stack_ffffffffffffffb8 =
           (int *)((long)&(in_RDI->
                          super_BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          ).ht_.rep.settings.
                          super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
                          super_TransparentHasher.super_Hasher + 8);
      local_18 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 ::UniqueKey(in_stack_ffffffffffffffa0,index);
      in_stack_ffffffffffffffb0 =
           (int *)((long)&(in_RDI->
                          super_BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          ).ht_.rep.settings.
                          super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
                          super_TransparentHasher.super_Hasher + 8);
      local_20 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 ::UniqueObject(in_stack_ffffffffffffffa0,
                                (int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      local_19 = google::
                 HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 ::get_data((HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                             *)in_stack_ffffffffffffffb0,&local_20);
      google::
      HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
      ::bracket_assign<bool>(in_RDI,in_stack_ffffffffffffffb8,(bool *)in_stack_ffffffffffffffb0);
    }
    google::
    HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::clear_no_resize((HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                       *)0xfe3201);
    in_stack_ffffffffffffffa0 =
         (HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)((long)&(in_RDI->
                    super_BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    ).ht_.rep.settings.
                    super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
                    super_TransparentHasher.super_Hasher + 8);
    local_24 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_ffffffffffffffa0,index);
    in_stack_ffffffffffffff98 =
         (int *)((long)&(in_RDI->
                        super_BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        ).ht_.rep.settings.
                        super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
                        super_TransparentHasher.super_Hasher + 8);
    local_2c = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueObject(in_stack_ffffffffffffffa0,
                              (int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    local_25 = google::
               HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::get_data((HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                           *)in_stack_ffffffffffffff98,&local_2c);
    google::
    HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::bracket_assign<bool>(in_RDI,in_stack_ffffffffffffffb8,(bool *)in_stack_ffffffffffffffb0);
    HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueKey(in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, BracketOperatorCrashing) {
  this->ht_.set_deleted_key(this->UniqueKey(1));
  for (int iters = 0; iters < 10; iters++) {
    // We start at 33 because after shrinking, we'll be at 32 buckets.
    for (int i = 33; i < 133; i++) {
      this->ht_.bracket_assign(this->UniqueKey(i),
                               this->ht_.get_data(this->UniqueObject(i)));
    }
    this->ht_.clear_no_resize();
    // This will force a shrink on the next insert, which we want to test.
    this->ht_.bracket_assign(this->UniqueKey(2),
                             this->ht_.get_data(this->UniqueObject(2)));
    this->ht_.erase(this->UniqueKey(2));
  }
}